

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O2

void __thiscall baryonyx::bit_array_impl::bit_array_impl(bit_array_impl *this,int size)

{
  this->m_size = size;
  this->m_block_size = size / 0x40 + 1;
  std::make_unique<unsigned_long[]>((size_t)&this->m_data);
  std::__fill_n_a<unsigned_long*,int,unsigned_long>
            ((this->m_data)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,this->m_block_size,&k_zeros)
  ;
  return;
}

Assistant:

bit_array_impl(int size)
      : m_size(size)
      , m_block_size((m_size / bit_per_block) + 1)
      , m_data(std::make_unique<underlying_type[]>(m_block_size))
    {
        std::fill_n(m_data.get(), m_block_size, k_zeros);
    }